

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O1

void __thiscall soplex::SVSetBase<double>::clear(SVSetBase<double> *this,int minNewSize)

{
  int iVar1;
  
  (this->super_ClassArray<soplex::Nonzero<double>_>).thesize = 0;
  iVar1 = (this->super_ClassArray<soplex::Nonzero<double>_>).themax;
  if (minNewSize < 1) {
    minNewSize = 10000;
    if (iVar1 < 0x2711) goto LAB_001c7f7f;
  }
  else if (iVar1 <= minNewSize + 10000) goto LAB_001c7f7f;
  ClassArray<soplex::Nonzero<double>_>::reMax
            (&this->super_ClassArray<soplex::Nonzero<double>_>,minNewSize,-1);
LAB_001c7f7f:
  (this->set).thesize = 0;
  (this->set).thenum = 0;
  (this->set).firstfree = ~(this->set).themax;
  (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first = (DLPSV *)0x0;
  (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last = (DLPSV *)0x0;
  this->unusedMem = 0;
  this->numUnusedMemUpdates = 0;
  return;
}

Assistant:

void clear(int minNewSize = -1)
   {
      SVSetBaseArray::clear();

      if(minNewSize <= 0)
      {
         if(SVSetBaseArray::max() > 10000)
            SVSetBaseArray::reMax(10000);
      }
      else
      {
         if(SVSetBaseArray::max() > minNewSize + 10000)
            SVSetBaseArray::reMax(minNewSize);
      }

      set.clear();
      list.clear();
      unusedMem = 0;
      numUnusedMemUpdates = 0;
   }